

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O3

Array __thiscall notch::pre::SquareAugmented::apply(SquareAugmented *this,Array *input)

{
  float fVar1;
  long lVar2;
  float *pfVar3;
  _func_int **__s;
  float *pfVar4;
  float *pfVar5;
  long *in_RDX;
  Array AVar6;
  
  lVar2 = *in_RDX;
  (this->super_ADatasetTransformer)._vptr_ADatasetTransformer = (_func_int **)(lVar2 * 2);
  __s = (_func_int **)operator_new(lVar2 * 8);
  this[1].super_ADatasetTransformer._vptr_ADatasetTransformer = __s;
  if ((_func_int **)(lVar2 * 2) == (_func_int **)0x0) {
    __s = (_func_int **)0x0;
  }
  else {
    memset(__s,0,lVar2 * 8);
  }
  pfVar3 = (float *)*in_RDX;
  pfVar4 = (float *)in_RDX[1];
  pfVar5 = pfVar4 + (long)pfVar3;
  if (pfVar3 == (float *)0x0) {
    pfVar4 = (float *)0x0;
    pfVar5 = (float *)0x0;
  }
  for (; pfVar4 != pfVar5; pfVar4 = pfVar4 + 1) {
    fVar1 = *pfVar4;
    *(float *)__s = fVar1;
    *(float *)((long)__s + lVar2 * 4) = fVar1 * fVar1;
    __s = (_func_int **)((long)__s + 4);
  }
  AVar6._M_data = pfVar3;
  AVar6._M_size = (size_t)this;
  return AVar6;
}

Assistant:

virtual Array apply(const Array &input) {
        size_t n = input.size();
        Array output(0.0, 2 * n);
        auto in = std::begin(input);
        auto inEnd = std::end(input);
        auto out = std::begin(output);
        auto outSquare = out + n;
        for (; in != inEnd; ++in, ++out, ++outSquare) {
            float x = *in;
            *out = x;
            *outSquare = x * x;
        }
        return output;
    }